

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O3

void __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,Model *model)

{
  uint *puVar1;
  uint v;
  LookupParameters *pLVar2;
  Parameters *pPVar3;
  long lVar4;
  ulong uVar5;
  uint local_74 [2];
  Dim local_6c;
  FastLSTMBuilder *local_48;
  FastLSTMBuilder *local_40;
  FastLSTMBuilder *local_38;
  
  local_38 = &this->l2rbuilder;
  cnn::FastLSTMBuilder::FastLSTMBuilder(local_38,LAYERS + 1,INPUT_WINDOWS_DIM,HIDDEN_DIM,model);
  cnn::FastLSTMBuilder::FastLSTMBuilder
            (&this->r2lbuilder,LAYERS + 1,INPUT_WINDOWS_DIM,HIDDEN_DIM,model);
  local_40 = &this->r2lbuilder;
  cnn::FastLSTMBuilder::FastLSTMBuilder(&this->orderbuilder,LAYERS,HIDDEN_DIM * 4,HIDDEN_DIM,model);
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = WORD_DIM;
  local_48 = &this->orderbuilder;
  pLVar2 = cnn::Model::add_lookup_parameters(model,VOCAB_SIZE,&local_6c,0.0);
  this->p_w = pLVar2;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_DIM;
  pLVar2 = cnn::Model::add_lookup_parameters(model,CHAR_SIZE,&local_6c,0.0);
  this->p_c = pLVar2;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding_2 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding_1 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding2 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = INPUT_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_wordpadding1 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding_2 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding_1 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding2 = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charpadding1 = pPVar3;
  local_74[0] = CHAR_HIDDEN_DIM;
  lVar4 = 0;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[1] = (CHAR_WINDOWS * 2 + 1) * CHAR_DIM;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charw2charh = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_HIDDEN_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charhbias = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = CHAR_HIDDEN_DIM;
  local_74[1] = CHAR_HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_charh2xMExp = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = CHAR_HIDDEN_DIM;
  local_74[1] = WORD_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_word2xMExp = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = CHAR_HIDDEN_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_xMExpbias = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = CHAR_HIDDEN_DIM;
  local_74[1] = CHAR_HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_xMExp2xExp = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = HIDDEN_DIM;
  local_74[1] = HIDDEN_DIM * 2;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_oh2ohxMExp = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = HIDDEN_DIM;
  local_74[1] = HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_osh2ohxMExp = pPVar3;
  local_74[0] = 1;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[1] = HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_u = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = LABEL_HIDDEN_DIM;
  local_74[1] = HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_oh2lh = pPVar3;
  local_6c.nd = 1;
  local_6c.bd = 1;
  local_6c.d[0] = LABEL_HIDDEN_DIM;
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_lhbias = pPVar3;
  local_6c.nd = 0;
  local_6c.bd = 1;
  local_74[0] = LABEL_SIZE;
  local_74[1] = LABEL_HIDDEN_DIM;
  lVar4 = 0;
  do {
    uVar5 = local_6c._28_8_ & 0xffffffff;
    puVar1 = (uint *)((long)local_74 + lVar4);
    lVar4 = lVar4 + 4;
    local_6c.nd = local_6c.nd + 1;
    local_6c.d[uVar5] = *puVar1;
  } while (lVar4 != 8);
  pPVar3 = cnn::Model::add_parameters(model,&local_6c,0.0);
  this->p_lh2l = pPVar3;
  return;
}

Assistant:

explicit RNNLanguageModel(Model& model) :
      l2rbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      r2lbuilder(LAYERS+1, INPUT_WINDOWS_DIM, HIDDEN_DIM, &model),
      orderbuilder(LAYERS, HIDDEN_DIM*4, HIDDEN_DIM, &model){

    p_w = model.add_lookup_parameters(VOCAB_SIZE, {WORD_DIM}); 
    p_c = model.add_lookup_parameters(CHAR_SIZE, {CHAR_DIM});
    
    p_wordpadding_2 = model.add_parameters({INPUT_DIM});
    p_wordpadding_1 = model.add_parameters({INPUT_DIM});
    p_wordpadding2 = model.add_parameters({INPUT_DIM});
    p_wordpadding1 = model.add_parameters({INPUT_DIM});

    p_charpadding_2 = model.add_parameters({CHAR_DIM});
    p_charpadding_1 = model.add_parameters({CHAR_DIM});
    p_charpadding2 = model.add_parameters({CHAR_DIM});
    p_charpadding1 = model.add_parameters({CHAR_DIM});

    p_charw2charh = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_DIM*(CHAR_WINDOWS*2+1)});
    p_charhbias = model.add_parameters({CHAR_HIDDEN_DIM});

    //attention pooling
    p_charh2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    p_word2xMExp = model.add_parameters({CHAR_HIDDEN_DIM, WORD_DIM});
    p_xMExpbias = model.add_parameters({CHAR_HIDDEN_DIM});
    p_xMExp2xExp = model.add_parameters({CHAR_HIDDEN_DIM, CHAR_HIDDEN_DIM});
    //

    // p_l2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_r2oh = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    // p_ohbias = model.add_parameters({HIDDEN_DIM});

    //attention labelling
    p_oh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM*2});
    p_osh2ohxMExp = model.add_parameters({HIDDEN_DIM, HIDDEN_DIM});
    p_u = model.add_parameters({1,HIDDEN_DIM});

    p_oh2lh = model.add_parameters({LABEL_HIDDEN_DIM,HIDDEN_DIM});
    p_lhbias = model.add_parameters({LABEL_HIDDEN_DIM});

    p_lh2l = model.add_parameters({LABEL_SIZE, LABEL_HIDDEN_DIM});
  }